

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::fms(Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  ulong uVar1;
  uintptr_t uVar2;
  float fVar3;
  double dVar4;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  if ((int)uVar1 == 5) {
    if ((((left->type).id != 5) || ((right->type).id != 5)) || (uVar1 != 5)) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x129,"double wasm::Literal::getf64() const");
    }
    dVar4 = ::fma(-(double)(left->field_0).func.super_IString.str._M_len,
                  (double)(right->field_0).i64,(double)(this->field_0).i64);
    (__return_storage_ptr__->field_0).i64 = (int64_t)dVar4;
    uVar2 = 5;
  }
  else {
    if ((int)uVar1 != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x641);
    }
    if ((((left->type).id != 4) || ((right->type).id != 4)) || (uVar1 != 4)) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x125,"float wasm::Literal::getf32() const");
    }
    fVar3 = fmaf(-(float)(left->field_0).i32,(float)(right->field_0).i32,(float)(this->field_0).i32)
    ;
    (__return_storage_ptr__->field_0).i32 = (int32_t)fVar3;
    uVar2 = 4;
  }
  (__return_storage_ptr__->type).id = uVar2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::fms(const Literal& left, const Literal& right) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(::fmaf(-left.getf32(), right.getf32(), getf32()));
      break;
    case Type::f64:
      return Literal(::fma(-left.getf64(), right.getf64(), getf64()));
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}